

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O2

bool __thiscall Env::GetConstant(Env *this,ID *id,int *pc)

{
  IDRecord *pIVar1;
  bool bVar2;
  
  bVar2 = false;
  pIVar1 = lookup(this,id,true,false);
  if (pIVar1 != (IDRecord *)0x0) {
    if (pIVar1->constant_set == true) {
      *pc = pIVar1->constant;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Env::GetConstant(const ID* id, int* pc) const
	{
	ASSERT(pc);
	// lookup without raising exception
	IDRecord* r = lookup(id, true, false);
	if ( r )
		return r->GetConstant(pc);
	else
		return false;
	}